

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfloat8_avx.h
# Opt level: O3

void __thiscall
embree::avx2::__roundline_internal::ConeGeometry<8>::ConeGeometry
          (ConeGeometry<8> *this,Vec4vf<8> *a,Vec4vf<8> *b)

{
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar1;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar2;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar3;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar5;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  
  aVar1 = (a->field_0).field_0.x.field_0;
  (this->p0).field_0.field_0.x.field_0 = aVar1;
  aVar2 = (a->field_0).field_0.y.field_0;
  (this->p0).field_0.field_0.y.field_0 = aVar2;
  aVar3 = (a->field_0).field_0.z.field_0;
  (this->p0).field_0.field_0.z.field_0 = aVar3;
  aVar4 = *(anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 *)&b->field_0;
  (this->p1).field_0.field_0.x.field_0 = aVar4;
  aVar5 = (b->field_0).field_0.y.field_0;
  (this->p1).field_0.field_0.y.field_0 = aVar5;
  aVar6 = (b->field_0).field_0.z.field_0;
  (this->p1).field_0.field_0.z.field_0 = aVar6;
  aVar1.v = (__m256)vsubps_avx(aVar4.v,aVar1.v);
  auVar21 = vsubps_avx((undefined1  [32])aVar5,(undefined1  [32])aVar2);
  auVar22 = vsubps_avx((undefined1  [32])aVar6,(undefined1  [32])aVar3);
  (this->dP).field_0.field_0.x.field_0 = aVar1;
  *(undefined1 (*) [32])((long)&(this->dP).field_0 + 0x20) = auVar21;
  *(undefined1 (*) [32])((long)&(this->dP).field_0 + 0x40) = auVar22;
  auVar24._4_4_ = auVar22._4_4_ * auVar22._4_4_;
  auVar24._0_4_ = auVar22._0_4_ * auVar22._0_4_;
  auVar24._8_4_ = auVar22._8_4_ * auVar22._8_4_;
  auVar24._12_4_ = auVar22._12_4_ * auVar22._12_4_;
  auVar24._16_4_ = auVar22._16_4_ * auVar22._16_4_;
  auVar24._20_4_ = auVar22._20_4_ * auVar22._20_4_;
  auVar24._24_4_ = auVar22._24_4_ * auVar22._24_4_;
  auVar24._28_4_ = auVar22._28_4_;
  auVar23 = vfmadd231ps_fma(auVar24,auVar21,auVar21);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),(undefined1  [32])aVar1,(undefined1  [32])aVar1);
  *(undefined1 (*) [32])(this->dPdP).field_0.v = ZEXT1632(auVar23);
  auVar22 = *(undefined1 (*) [32])((long)&a->field_0 + 0x60);
  *(undefined1 (*) [32])(this->r0).field_0.v = auVar22;
  fVar7 = auVar22._0_4_;
  fVar9 = auVar22._4_4_;
  fVar11 = auVar22._8_4_;
  fVar13 = auVar22._12_4_;
  fVar15 = auVar22._16_4_;
  fVar17 = auVar22._20_4_;
  fVar19 = auVar22._24_4_;
  (this->sqr_r0).field_0.v[0] = fVar7 * fVar7;
  (this->sqr_r0).field_0.v[1] = fVar9 * fVar9;
  (this->sqr_r0).field_0.v[2] = fVar11 * fVar11;
  (this->sqr_r0).field_0.v[3] = fVar13 * fVar13;
  (this->sqr_r0).field_0.v[4] = fVar15 * fVar15;
  (this->sqr_r0).field_0.v[5] = fVar17 * fVar17;
  (this->sqr_r0).field_0.v[6] = fVar19 * fVar19;
  (this->sqr_r0).field_0.i[7] = auVar21._28_4_;
  aVar1 = (b->field_0).field_0.w.field_0;
  (this->r1).field_0 = aVar1;
  auVar21 = vsubps_avx((undefined1  [32])aVar1,auVar22);
  *(undefined1 (*) [32])(this->dr).field_0.v = auVar21;
  fVar8 = auVar21._0_4_;
  fVar10 = auVar21._4_4_;
  aVar1.v[1] = fVar10 * fVar10;
  aVar1.v[0] = fVar8 * fVar8;
  fVar12 = auVar21._8_4_;
  aVar1.v[2] = fVar12 * fVar12;
  fVar14 = auVar21._12_4_;
  aVar1.v[3] = fVar14 * fVar14;
  fVar16 = auVar21._16_4_;
  aVar1.v[4] = fVar16 * fVar16;
  fVar18 = auVar21._20_4_;
  aVar1.v[5] = fVar18 * fVar18;
  fVar20 = auVar21._24_4_;
  aVar1.v[6] = fVar20 * fVar20;
  aVar1.i[7] = aVar4.i[7];
  (this->drdr).field_0 = aVar1;
  (this->r0dr).field_0.v[0] = fVar7 * fVar8;
  (this->r0dr).field_0.v[1] = fVar9 * fVar10;
  (this->r0dr).field_0.v[2] = fVar11 * fVar12;
  (this->r0dr).field_0.v[3] = fVar13 * fVar14;
  (this->r0dr).field_0.v[4] = fVar15 * fVar16;
  (this->r0dr).field_0.v[5] = fVar17 * fVar18;
  (this->r0dr).field_0.v[6] = fVar19 * fVar20;
  (this->r0dr).field_0.i[7] = auVar22._28_4_;
  aVar1.v = (__m256)vsubps_avx(ZEXT1632(auVar23),aVar1.v);
  (this->g).field_0 = aVar1;
  return;
}

Assistant:

__forceinline vfloat(__m256 a) : v(a) {}